

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O3

boolean empty_output_buffer(j_compress_ptr cinfo)

{
  jpeg_destination_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  size_t sVar3;
  
  pjVar1 = cinfo->dest;
  sVar3 = fwrite((void *)pjVar1[1].free_in_buffer,1,0x1000,(FILE *)pjVar1[1].next_output_byte);
  if (sVar3 != 0x1000) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x25;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1->next_output_byte = (JOCTET *)pjVar1[1].free_in_buffer;
  pjVar1->free_in_buffer = 0x1000;
  return 1;
}

Assistant:

METHODDEF(boolean)
empty_output_buffer(j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr)cinfo->dest;

  if (JFWRITE(dest->outfile, dest->buffer, OUTPUT_BUF_SIZE) !=
      (size_t)OUTPUT_BUF_SIZE)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  dest->pub.next_output_byte = dest->buffer;
  dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;

  return TRUE;
}